

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# region_impl.hpp
# Opt level: O0

pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
* __thiscall
toml::detail::region::take_line_abi_cxx11_(region *this,const_iterator begin,const_iterator end)

{
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  __first;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  __last;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  __first_00;
  bool bVar1;
  bool bVar2;
  reference puVar3;
  undefined8 in_RCX;
  undefined8 in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  in_RDI;
  string retval;
  size_t offset;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  lf_after;
  reverse_iterator<__gnu_cxx::__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  lf_before;
  char_type lf;
  const_iterator capped_end;
  const_iterator capped_begin;
  difference_type dist_after;
  difference_type dist_before;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  in_stack_fffffffffffffe38;
  undefined7 in_stack_fffffffffffffe40;
  undefined1 in_stack_fffffffffffffe47;
  undefined1 uVar4;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  in_stack_fffffffffffffe48;
  undefined7 in_stack_fffffffffffffe50;
  undefined1 in_stack_fffffffffffffe57;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  _Var5;
  char *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  reverse_iterator<__gnu_cxx::__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  *__last_00;
  reverse_iterator<__gnu_cxx::__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  *in_stack_fffffffffffffe78;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  first;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_a8;
  uchar *local_a0;
  char local_98 [8];
  undefined8 local_90;
  uchar local_88 [8];
  reverse_iterator<__gnu_cxx::__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  local_80;
  undefined1 local_71 [33];
  uchar *local_50;
  undefined8 local_48;
  difference_type local_40;
  undefined8 local_38;
  uchar *local_30;
  difference_type local_28;
  undefined8 local_18;
  undefined8 local_10;
  
  first._M_current = in_RDI._M_current;
  local_18 = in_RCX;
  local_10 = in_RDX;
  CLI::std::
  __shared_ptr_access<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator->((__shared_ptr_access<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x294a16);
  local_30 = (uchar *)CLI::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::cbegin
                                (in_stack_fffffffffffffe38._M_current);
  local_38 = local_10;
  _Var5._M_current._7_1_ = in_stack_fffffffffffffe57;
  _Var5._M_current._0_7_ = in_stack_fffffffffffffe50;
  local_28 = std::
             distance<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                       (_Var5,in_stack_fffffffffffffe48);
  local_48 = local_18;
  CLI::std::
  __shared_ptr_access<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator->((__shared_ptr_access<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x294a6d);
  local_50 = (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::cend
                                (in_stack_fffffffffffffe38._M_current);
  __first._M_current._7_1_ = in_stack_fffffffffffffe57;
  __first._M_current._0_7_ = in_stack_fffffffffffffe50;
  local_40 = std::
             distance<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                       (__first,in_stack_fffffffffffffe48);
  if (local_28 < 0x1f) {
    CLI::std::
    __shared_ptr_access<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x294aaf);
    local_71._25_8_ =
         CLI::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::cbegin
                   ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                    in_stack_fffffffffffffe38._M_current);
  }
  else {
    local_71._17_8_ = local_10;
    local_71._25_8_ =
         std::
         prev<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                   (in_stack_fffffffffffffe38,0x294ae3);
  }
  if (local_40 < 0x1f) {
    CLI::std::
    __shared_ptr_access<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x294b00);
    local_71._9_8_ =
         std::vector<unsigned_char,_std::allocator<unsigned_char>_>::cend
                   ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                    in_stack_fffffffffffffe38._M_current);
  }
  else {
    local_71._1_8_ = local_18;
    local_71._9_8_ =
         std::
         next<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                   (in_stack_fffffffffffffe38,0x294b34);
  }
  local_71[0] = 10;
  local_90 = local_10;
  _Var5._M_current = local_88;
  std::
  make_reverse_iterator<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
            (in_stack_fffffffffffffe48);
  local_a0 = (uchar *)local_71._25_8_;
  __rhs = local_98;
  std::
  make_reverse_iterator<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
            (in_stack_fffffffffffffe48);
  __last_00 = &local_80;
  __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_71;
  std::
  find<std::reverse_iterator<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,unsigned_char>
            (in_stack_fffffffffffffe78,__last_00,(uchar *)__lhs);
  __last._M_current._7_1_ = in_stack_fffffffffffffe57;
  __last._M_current._0_7_ = in_stack_fffffffffffffe50;
  local_a8 = std::
             find<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,unsigned_char>
                       (_Var5,__last,in_stack_fffffffffffffe48._M_current);
  std::
  reverse_iterator<__gnu_cxx::__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::base(__last_00);
  __first_00._M_current._7_1_ = in_stack_fffffffffffffe57;
  __first_00._M_current._0_7_ = in_stack_fffffffffffffe50;
  std::
  distance<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
            (__first_00,in_stack_fffffffffffffe48);
  std::
  reverse_iterator<__gnu_cxx::__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::base(__last_00);
  make_string<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
            (first,in_RDI);
  std::
  reverse_iterator<__gnu_cxx::__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::base(__last_00);
  CLI::std::
  __shared_ptr_access<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator->((__shared_ptr_access<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x294ca9);
  CLI::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::cbegin
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             in_stack_fffffffffffffe38._M_current);
  bVar1 = __gnu_cxx::
          operator==<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    ((__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      *)CONCAT17(in_stack_fffffffffffffe47,in_stack_fffffffffffffe40),
                     (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      *)in_stack_fffffffffffffe38._M_current);
  bVar2 = false;
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    in_stack_fffffffffffffe48._M_current =
         std::
         reverse_iterator<__gnu_cxx::__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
         ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                      *)CONCAT17(in_stack_fffffffffffffe47,in_stack_fffffffffffffe40));
    bVar2 = *(uchar *)&(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        in_stack_fffffffffffffe48._M_current)->_M_dataplus)._M_p != '\n';
  }
  if (bVar2) {
    std::operator+((char *)first._M_current,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_RDI._M_current);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (in_RSI,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      first._M_current);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffffe47,in_stack_fffffffffffffe40));
  }
  CLI::std::
  __shared_ptr_access<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator->((__shared_ptr_access<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x294d96);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::cend
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             in_stack_fffffffffffffe38._M_current);
  bVar2 = __gnu_cxx::
          operator==<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    ((__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      *)CONCAT17(in_stack_fffffffffffffe47,in_stack_fffffffffffffe40),
                     (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      *)in_stack_fffffffffffffe38._M_current);
  uVar4 = false;
  if (((bVar2 ^ 0xffU) & 1) != 0) {
    puVar3 = __gnu_cxx::
             __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             ::operator*(&local_a8);
    uVar4 = *puVar3 != '\n';
  }
  if ((bool)uVar4 != false) {
    std::operator+(__lhs,__rhs);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (in_RSI,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      first._M_current);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(uVar4,in_stack_fffffffffffffe40));
  }
  std::make_pair<std::__cxx11::string&,unsigned_long&>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffe48._M_current,
             (unsigned_long *)CONCAT17(uVar4,in_stack_fffffffffffffe40));
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(uVar4,in_stack_fffffffffffffe40));
  return (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
          *)first._M_current;
}

Assistant:

TOML11_INLINE std::pair<std::string, std::size_t>
region::take_line(const_iterator begin, const_iterator end) const
{
    // To omit long line, we cap region by before/after 30 chars
    const auto dist_before = std::distance(source_->cbegin(), begin);
    const auto dist_after  = std::distance(end, source_->cend());

    const const_iterator capped_begin = (dist_before <= 30) ? source_->cbegin() : std::prev(begin, 30);
    const const_iterator capped_end   = (dist_after  <= 30) ? source_->cend()   : std::next(end,   30);

    const auto lf = char_type('\n');
    const auto lf_before = std::find(cxx::make_reverse_iterator(begin),
                                     cxx::make_reverse_iterator(capped_begin), lf);
    const auto lf_after  = std::find(end, capped_end, lf);

    auto offset = static_cast<std::size_t>(std::distance(lf_before.base(), begin));

    std::string retval = make_string(lf_before.base(), lf_after);

    if(lf_before.base() != source_->cbegin() && *lf_before != lf)
    {
        retval = "... " + retval;
        offset += 4;
    }

    if(lf_after != source_->cend() && *lf_after != lf)
    {
        retval = retval + " ...";
    }

    return std::make_pair(retval, offset);
}